

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O2

void __thiscall
DIS::ElectromagneticEmissionSystemData::marshal
          (ElectromagneticEmissionSystemData *this,DataStream *dataStream)

{
  pointer pEVar1;
  long lVar2;
  ulong uVar3;
  ElectromagneticEmissionBeamData x;
  ElectromagneticEmissionBeamData EStack_a8;
  
  DataStream::operator<<(dataStream,this->_systemDataLength);
  DataStream::operator<<
            (dataStream,
             (uchar)((uint)(*(int *)&(this->_beamDataRecords).
                                     super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->_beamDataRecords).
                                    super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 7));
  DataStream::operator<<(dataStream,this->_emissionsPadding2);
  EmitterSystem::marshal(&this->_emitterSystem,dataStream);
  Vector3Float::marshal(&this->_location,dataStream);
  lVar2 = 0;
  for (uVar3 = 0;
      pEVar1 = (this->_beamDataRecords).
               super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->_beamDataRecords).
                            super__Vector_base<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 7);
      uVar3 = uVar3 + 1) {
    ElectromagneticEmissionBeamData::ElectromagneticEmissionBeamData
              (&EStack_a8,
               (ElectromagneticEmissionBeamData *)
               ((long)&pEVar1->_vptr_ElectromagneticEmissionBeamData + lVar2));
    ElectromagneticEmissionBeamData::marshal(&EStack_a8,dataStream);
    ElectromagneticEmissionBeamData::~ElectromagneticEmissionBeamData(&EStack_a8);
    lVar2 = lVar2 + 0x80;
  }
  return;
}

Assistant:

void ElectromagneticEmissionSystemData::marshal(DataStream& dataStream) const
{
    dataStream << _systemDataLength;
    dataStream << ( unsigned char )_beamDataRecords.size();
    dataStream << _emissionsPadding2;
    _emitterSystem.marshal(dataStream);
    _location.marshal(dataStream);

    for(size_t idx = 0; idx < _beamDataRecords.size(); idx++)
    {
        ElectromagneticEmissionBeamData x = _beamDataRecords[idx];
        x.marshal(dataStream);
    }
}